

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellUtilityTest.cpp
# Opt level: O1

string * anon_unknown.dwarf_599fd::quoted(string *__return_storage_ptr__,string *s)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string quote;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\'","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_50,local_48 + (long)local_50);
  std::__cxx11::string::_M_append((char *)local_70,(ulong)(s->_M_dataplus)._M_p);
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_70,(ulong)local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string quoted(std::string s) {
#if defined(_WIN32)
  std::string quote = "\"";
#else
  std::string quote = "'";
#endif
  return quote + s + quote;
}